

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuSetupOal(sqlite3rbu *p,RbuState *pState)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  if (pState->zTbl != (char *)0x0) {
    do {
      pcVar4 = (p->objiter).zTbl;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = sqlite3_mprintf("rbu_state mismatch error");
        p->zErrmsg = pcVar4;
        iVar3 = 1;
        break;
      }
      if ((p->objiter).bCleanup == 0) {
        pcVar1 = (p->objiter).zIdx;
        pcVar2 = pState->zIdx;
        if ((pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) ||
           ((pcVar1 != (char *)0x0 && pcVar2 != (char *)0x0 &&
            (iVar3 = sqlite3StrICmp(pcVar1,pcVar2), iVar3 == 0)))) {
          pcVar1 = pState->zDataTbl;
          if (pcVar1 == (char *)0x0) {
            pcVar1 = pState->zTbl;
            pcVar2 = pcVar1;
          }
          else {
            pcVar4 = (p->objiter).zDataTbl;
            pcVar2 = pcVar4;
          }
          if ((pcVar2 != (char *)0x0) && (iVar3 = sqlite3StrICmp(pcVar4,pcVar1), iVar3 == 0)) {
            iVar3 = pState->nRow;
            p->nStep = iVar3;
            iVar3 = rbuObjIterPrepareAll(p,&p->objiter,iVar3);
            break;
          }
        }
      }
      iVar3 = rbuObjIterNext(p,&p->objiter);
    } while (iVar3 == 0);
    p->rc = iVar3;
  }
  return;
}

Assistant:

static void rbuSetupOal(sqlite3rbu *p, RbuState *pState){
  assert( p->rc==SQLITE_OK );
  if( pState->zTbl ){
    RbuObjIter *pIter = &p->objiter;
    int rc = SQLITE_OK;

    while( rc==SQLITE_OK && pIter->zTbl && (pIter->bCleanup 
       || rbuStrCompare(pIter->zIdx, pState->zIdx)
       || (pState->zDataTbl==0 && rbuStrCompare(pIter->zTbl, pState->zTbl))
       || (pState->zDataTbl && rbuStrCompare(pIter->zDataTbl, pState->zDataTbl))
    )){
      rc = rbuObjIterNext(p, pIter);
    }

    if( rc==SQLITE_OK && !pIter->zTbl ){
      rc = SQLITE_ERROR;
      p->zErrmsg = sqlite3_mprintf("rbu_state mismatch error");
    }

    if( rc==SQLITE_OK ){
      p->nStep = pState->nRow;
      rc = rbuObjIterPrepareAll(p, &p->objiter, p->nStep);
    }

    p->rc = rc;
  }
}